

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O1

ENetAcknowledgement *
enet_peer_queue_acknowledgement(ENetPeer *peer,ENetProtocol *command,enet_uint16 sentTime)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ENetAcknowledgement *data;
  ushort uVar9;
  
  if ((ulong)(command->header).channelID < peer->channelCount) {
    uVar2 = (command->header).reliableSequenceNumber >> 0xc;
    uVar1 = *(ushort *)
             ((long)peer->channels->reliableWindows +
             (ulong)((uint)(command->header).channelID * 0x50) + 0x20);
    uVar3 = uVar1 >> 0xc;
    uVar9 = uVar2 + 0x10;
    if (uVar1 <= (command->header).reliableSequenceNumber) {
      uVar9 = uVar2;
    }
    if (uVar9 <= (ushort)(uVar3 + 8) && (ushort)(uVar3 + 7) <= uVar9) {
      return (ENetAcknowledgement *)0x0;
    }
  }
  data = (ENetAcknowledgement *)enet_malloc(0x48);
  if (data == (ENetAcknowledgement *)0x0) {
    return (ENetAcknowledgement *)0x0;
  }
  peer->outgoingDataTotal = peer->outgoingDataTotal + 8;
  data->sentTime = (uint)sentTime;
  uVar4 = *(undefined8 *)&(command->connect).incomingSessionID;
  uVar5 = *(undefined8 *)((long)&(command->connect).windowSize + 2);
  uVar6 = *(undefined8 *)((long)&(command->connect).incomingBandwidth + 2);
  uVar7 = *(undefined8 *)((long)&(command->connect).packetThrottleInterval + 2);
  uVar8 = *(undefined8 *)((long)&(command->connect).packetThrottleDeceleration + 2);
  (data->command).acknowledge = command->acknowledge;
  *(undefined8 *)((long)&data->command + 8) = uVar4;
  *(undefined8 *)((long)&data->command + 0x10) = uVar5;
  *(undefined8 *)((long)&data->command + 0x18) = uVar6;
  *(undefined8 *)((long)&data->command + 0x20) = uVar7;
  *(undefined8 *)((long)&data->command + 0x28) = uVar8;
  *(undefined2 *)((long)&data->command + 0x30) = *(undefined2 *)((long)&(command->connect).data + 2)
  ;
  enet_list_insert(&(peer->acknowledgements).sentinel,data);
  return data;
}

Assistant:

ENetAcknowledgement *
enet_peer_queue_acknowledgement (ENetPeer * peer, const ENetProtocol * command, enet_uint16 sentTime)
{
    ENetAcknowledgement * acknowledgement;

    if (command -> header.channelID < peer -> channelCount)
    {
        ENetChannel * channel = & peer -> channels [command -> header.channelID];
        enet_uint16 reliableWindow = command -> header.reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE,
                    currentWindow = channel -> incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

        if (command -> header.reliableSequenceNumber < channel -> incomingReliableSequenceNumber)
           reliableWindow += ENET_PEER_RELIABLE_WINDOWS;

        if (reliableWindow >= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1 && reliableWindow <= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS)
          return NULL;
    }

    acknowledgement = (ENetAcknowledgement *) enet_malloc (sizeof (ENetAcknowledgement));
    if (acknowledgement == NULL)
      return NULL;

    peer -> outgoingDataTotal += sizeof (ENetProtocolAcknowledge);

    acknowledgement -> sentTime = sentTime;
    acknowledgement -> command = * command;
    
    enet_list_insert (enet_list_end (& peer -> acknowledgements), acknowledgement);
    
    return acknowledgement;
}